

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O2

bool __thiscall EOPlus::Parser::GetToken(Parser *this,Token *t,uint allow)

{
  undefined1 local_60 [80];
  
  Parser_Token_Server_Base::GetToken
            ((Token *)local_60,
             (this->tok)._M_t.
             super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ._M_t.
             super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl,allow);
  Token::operator=(t,(Token *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x18));
  return t->type != Invalid;
}

Assistant:

bool GetToken(Token& t, unsigned int allow = 0xFFFFFFFF)
			{
				t = this->tok->GetToken(allow);
				return bool(t);
			}